

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O3

void njoy::ENDFtk::section::Type<2,_151>::
     UnresolvedLValueBase<njoy::ENDFtk::section::Type<2,_151>::LJValueType<njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_void>::JValue>
     ::verifySize(int NJS)

{
  undefined8 *puVar1;
  
  if (0 < NJS) {
    return;
  }
  tools::Log::error<char_const*>("Encountered illegal NJS value");
  tools::Log::info<char_const*>("NJS should be larger than zero");
  tools::Log::info<char_const*,int>("NJS value: {}",NJS);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NJS ) {

  if ( NJS < 1 ) {

    Log::error( "Encountered illegal NJS value" );
    Log::info( "NJS should be larger than zero" );
    Log::info( "NJS value: {}", NJS );
    throw std::exception();
  }
}